

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesFabricPortGetFabricErrorCounters
          (zes_fabric_port_handle_t hPort,zes_fabric_port_error_counters_t *pErrors)

{
  zes_pfnFabricPortGetFabricErrorCounters_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFabricPortGetFabricErrorCounters_t pfnGetFabricErrorCounters;
  zes_fabric_port_error_counters_t *pErrors_local;
  zes_fabric_port_handle_t hPort_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->FabricPort).pfnGetFabricErrorCounters;
    if (p_Var1 == (zes_pfnFabricPortGetFabricErrorCounters_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hPort_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hPort_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hPort_local._4_4_ = (*p_Var1)(hPort,pErrors);
    }
  }
  else {
    hPort_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hPort_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFabricPortGetFabricErrorCounters(
    zes_fabric_port_handle_t hPort,                 ///< [in] Handle for the component.
    zes_fabric_port_error_counters_t* pErrors       ///< [in,out] Will contain the Fabric port Error counters.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFabricPortGetFabricErrorCounters_t pfnGetFabricErrorCounters = [&result] {
        auto pfnGetFabricErrorCounters = ze_lib::context->zesDdiTable.load()->FabricPort.pfnGetFabricErrorCounters;
        if( nullptr == pfnGetFabricErrorCounters ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetFabricErrorCounters;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetFabricErrorCounters( hPort, pErrors );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetFabricErrorCounters = ze_lib::context->zesDdiTable.load()->FabricPort.pfnGetFabricErrorCounters;
    if( nullptr == pfnGetFabricErrorCounters ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetFabricErrorCounters( hPort, pErrors );
    #endif
}